

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgExoticQuadrature.hpp
# Opt level: O1

void TasGrid::getGaussNodesAndWeights<true>
               (int n,vector<double,_std::allocator<double>_> *ref_points,
               vector<double,_std::allocator<double>_> *ref_weights,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *points_cache,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *weights_cache)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  long lVar4;
  double *pdVar5;
  pointer pvVar6;
  double *pdVar7;
  double *pdVar8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar9;
  const_iterator __begin2;
  double *pdVar10;
  pointer pdVar11;
  ulong uVar12;
  double *pdVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  double *pdVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  double dVar24;
  double dVar25;
  vector<double,_std::allocator<double>_> diag;
  vector<double,_std::allocator<double>_> offdiag;
  vector<double,_std::allocator<double>_> dummy_diag;
  vector<double,_std::allocator<double>_> poly_vals;
  vector<double,_std::allocator<double>_> poly_m1_vals;
  vector<double,_std::allocator<double>_> dummy_offdiag;
  allocator_type local_109;
  vector<double,_std::allocator<double>_> *local_108;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_100;
  vector<double,_std::allocator<double>_> local_f8;
  vector<double,_std::allocator<double>_> local_d8;
  vector<double,_std::allocator<double>_> *local_b8;
  void *local_b0 [2];
  long local_a0;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_80;
  void *local_68 [2];
  long local_58;
  double local_50;
  ulong local_48;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_40;
  ulong local_38;
  
  if (gauss_quadrature_version == '\0') {
    gauss_quadrature_version = '\x01';
  }
  pdVar2 = (ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar16 = (long)pdVar3 - (long)pdVar2;
  pdVar10 = (ref_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pdVar13 = (ref_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_108 = ref_points;
  local_100 = weights_cache;
  local_b8 = ref_weights;
  if (lVar16 == (long)pdVar13 - (long)pdVar10) {
    if (pdVar3 != pdVar2) {
      local_50 = 0.0;
      for (; pdVar10 != pdVar13; pdVar10 = pdVar10 + 1) {
        local_50 = local_50 + *pdVar10;
      }
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (double *)0x0;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_80,lVar16 >> 3,(value_type_conflict *)&local_98,(allocator_type *)&local_f8)
      ;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x3ff0000000000000;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_98,
                 (long)(local_108->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(local_108->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 3,(value_type_conflict *)&local_f8,
                 (allocator_type *)&local_d8);
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (double *)0x0;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (double *)0x0;
      local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (double *)0x0;
      local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (double *)0x0;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(points_cache,(long)n);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(local_100,(long)n);
      if (0 < n) {
        uVar23 = 0;
        local_48 = (ulong)(uint)n;
        local_40 = points_cache;
        do {
          pvVar9 = local_40;
          local_b0[0] = (void *)0x0;
          if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (&local_f8,
                       (iterator)
                       local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,(double *)local_b0);
          }
          else {
            *local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish = 0.0;
            local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          if (uVar23 != 0) {
            dVar24 = NAN;
            lVar16 = (long)(local_108->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(local_108->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start;
            if (lVar16 != 0) {
              lVar16 = lVar16 >> 3;
              dVar24 = 0.0;
              lVar17 = 0;
              dVar25 = 0.0;
              do {
                dVar1 = (local_b8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar17];
                dVar24 = dVar24 + local_98.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar17] *
                                  local_98.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar17] * dVar1;
                dVar25 = dVar25 + local_80.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar17] *
                                  local_80.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar17] * dVar1;
                lVar17 = lVar17 + 1;
              } while (lVar16 + (ulong)(lVar16 == 0) != lVar17);
              dVar24 = dVar24 / dVar25;
            }
            if (dVar24 < 0.0) {
              local_b0[0] = (void *)sqrt(dVar24);
            }
            else {
              local_b0[0] = (void *)SQRT(dVar24);
            }
            if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                        (&local_d8,
                         (iterator)
                         local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(double *)local_b0);
            }
            else {
              *local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish = (double)local_b0[0];
              local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          local_38 = uVar23;
          if (gauss_quadrature_version == '\0') {
            TasGrid::TasmanianTridiagonalSolver::getSymmetricEigenvalues
                      ((int)(vector *)local_b0,(vector *)(ulong)((int)uVar23 + 1),
                       (vector *)&local_f8);
            std::vector<double,_std::allocator<double>_>::_M_move_assign
                      ((pvVar9->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar23,(vector *)local_b0);
            if (local_b0[0] != (void *)0x0) {
              operator_delete(local_b0[0],local_a0 - (long)local_b0[0]);
            }
            pvVar6 = (pvVar9->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar16 = *(long *)&pvVar6[uVar23].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data;
            uVar14 = (long)*(pointer *)
                            ((long)&pvVar6[uVar23].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data + 8) - lVar16;
            if ((uVar14 & 8) != 0) {
              *(undefined8 *)(((long)uVar14 >> 1) + -4 + lVar16) = 0;
            }
            local_68[0] = (void *)0x0;
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)local_b0,
                       (long)*(pointer *)
                              ((long)&pvVar6[uVar23].
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data + 8) -
                       *(long *)&pvVar6[uVar23].super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data >> 3,
                       (value_type_conflict *)local_68,&local_109);
            std::vector<double,_std::allocator<double>_>::_M_move_assign
                      ((local_100->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar23,(vector *)local_b0);
            if (local_b0[0] != (void *)0x0) {
              operator_delete(local_b0[0],local_a0 - (long)local_b0[0]);
            }
            pvVar6 = (pvVar9->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar16 = *(long *)&pvVar6[uVar23].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data;
            lVar17 = (long)*(pointer *)
                            ((long)&pvVar6[uVar23].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data + 8) - lVar16;
            if (lVar17 != 0) {
              uVar12 = lVar17 >> 3;
              pdVar2 = (local_108->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar3 = (local_108->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
              pvVar6 = (local_100->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              lVar18 = (long)pdVar3 - (long)pdVar2 >> 3;
              pdVar11 = (local_b8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              lVar15 = 0;
              lVar17 = lVar16;
              uVar14 = uVar12;
              do {
                if (pdVar3 != pdVar2) {
                  lVar4 = *(long *)&pvVar6[uVar23].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data;
                  lVar20 = 0;
                  do {
                    dVar24 = 1.0;
                    if (lVar15 != 0) {
                      lVar21 = 0;
                      dVar24 = 1.0;
                      do {
                        dVar25 = *(double *)(lVar16 + lVar21 * 8);
                        dVar24 = dVar24 * ((pdVar2[lVar20] - dVar25) /
                                          (*(double *)(lVar16 + lVar15 * 8) - dVar25));
                        lVar21 = lVar21 + 1;
                      } while (lVar15 != lVar21);
                    }
                    if (lVar15 + 1U < uVar12) {
                      uVar22 = 1;
                      do {
                        dVar25 = *(double *)(lVar17 + uVar22 * 8);
                        dVar24 = dVar24 * ((pdVar2[lVar20] - dVar25) /
                                          (*(double *)(lVar16 + lVar15 * 8) - dVar25));
                        uVar22 = uVar22 + 1;
                      } while (uVar14 != uVar22);
                    }
                    *(double *)(lVar4 + lVar15 * 8) =
                         dVar24 * pdVar11[lVar20] + *(double *)(lVar4 + lVar15 * 8);
                    lVar20 = lVar20 + 1;
                  } while (lVar20 != lVar18 + (ulong)(lVar18 == 0));
                }
                lVar15 = lVar15 + 1;
                uVar14 = uVar14 - 1;
                lVar17 = lVar17 + 8;
              } while (lVar15 != uVar12 + (uVar12 == 0));
            }
          }
          else {
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)local_b0,&local_f8);
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)local_68,&local_d8);
            TasGrid::TasmanianTridiagonalSolver::decompose
                      ((vector *)local_b0,(vector *)local_68,local_50,
                       (vector *)
                       ((pvVar9->
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar23),
                       (vector *)
                       ((local_100->
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar23));
            if (local_68[0] != (void *)0x0) {
              operator_delete(local_68[0],local_58 - (long)local_68[0]);
            }
            if (local_b0[0] != (void *)0x0) {
              operator_delete(local_b0[0],local_a0 - (long)local_b0[0]);
            }
          }
          pdVar3 = local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          pdVar2 = local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pdVar11 = local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar10 = local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = pdVar11;
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = pdVar2;
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = pdVar3;
          pdVar13 = (local_108->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar5 = (local_108->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          if (pdVar13 != pdVar5) {
            pvVar6 = (local_40->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pdVar7 = pvVar6[local_38].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar8 = *(pointer *)
                      ((long)&pvVar6[local_38].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data + 8);
            do {
              dVar24 = 1.0;
              if (pdVar7 != pdVar8) {
                dVar24 = 1.0;
                pdVar19 = pdVar7;
                do {
                  dVar24 = dVar24 * (*pdVar13 - *pdVar19);
                  pdVar19 = pdVar19 + 1;
                } while (pdVar19 != pdVar8);
              }
              *pdVar11 = dVar24;
              pdVar13 = pdVar13 + 1;
              pdVar11 = pdVar11 + 1;
            } while (pdVar13 != pdVar5);
          }
          uVar23 = local_38 + 1;
        } while (uVar23 != local_48);
      }
      if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
    __assert_fail("ref_points.size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/tsgExoticQuadrature.hpp"
                  ,0x9f,
                  "void TasGrid::getGaussNodesAndWeights(const int, const std::vector<double> &, const std::vector<double> &, std::vector<std::vector<double>> &, std::vector<std::vector<double>> &) [is_symmetric = true]"
                 );
  }
  __assert_fail("ref_points.size() == ref_weights.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/tsgExoticQuadrature.hpp"
                ,0x9e,
                "void TasGrid::getGaussNodesAndWeights(const int, const std::vector<double> &, const std::vector<double> &, std::vector<std::vector<double>> &, std::vector<std::vector<double>> &) [is_symmetric = true]"
               );
}

Assistant:

inline void getGaussNodesAndWeights(const int n, const std::vector<double> &ref_points, const std::vector<double> &ref_weights,
                                    std::vector<std::vector<double>> &points_cache, std::vector<std::vector<double>> &weights_cache) {
    #ifndef Tasmanian_ENABLE_BLAS
    // If BLAS is not enabled, we must use an implementation that does not require it.
    if (gauss_quadrature_version == 1) {
        gauss_quadrature_version = 2;
    }
    #endif
    // Compute the roots incrementally.
    assert(ref_points.size() == ref_weights.size());
    assert(ref_points.size() > 0);
    double mu0 = 0.0;
    for (auto &w : ref_weights) mu0 += w;
    std::vector<double> poly_m1_vals(ref_points.size(), 0.0), poly_vals(ref_points.size(), 1.0);
    std::vector<double> diag, offdiag;
    points_cache.resize(n);
    weights_cache.resize(n);
    for (int i=0; i<n; i++) {
        // Form the diagonal and offdiagonal vectors of the Jacobi matrix.
        if (is_symmetric) {
            diag.push_back(0.0);
        } else {
            double diag_numr = 0.0;
            double diag_denm = 0.0;
            for (size_t j=0; j<ref_points.size(); j++) {
            diag_numr += ref_points[j] * (poly_vals[j] * poly_vals[j]) * ref_weights[j];
            diag_denm += (poly_vals[j] * poly_vals[j]) * ref_weights[j];
            }
            diag.push_back(diag_numr / diag_denm);
        }
        if (i >= 1) {
            double sqr_offdiag_numr = 0.0;
            double sqr_offdiag_denm = 0.0;
            for (size_t j=0; j<ref_points.size(); j++) {
                sqr_offdiag_numr += (poly_vals[j] * poly_vals[j]) * ref_weights[j];
                sqr_offdiag_denm += (poly_m1_vals[j] * poly_m1_vals[j])  * ref_weights[j];
            }
            offdiag.push_back(std::sqrt(sqr_offdiag_numr / sqr_offdiag_denm));
        }
        // Compute the Gauss points and weights.
        if (gauss_quadrature_version == 1) {
            // Use LAPACK to obtain the Gauss points, and use the reference points and weights to obtain the Gauss weights.
            // Note that the matrix is always symmetric even if the weights function is not.
            points_cache[i] = TasmanianTridiagonalSolver::getSymmetricEigenvalues(i+1, diag, offdiag);
            if (points_cache[i].size() % 2 == 1 && is_symmetric) {
                points_cache[i][(points_cache[i].size() - 1) / 2] = 0.0;
            }
            weights_cache[i] = std::vector<double>(points_cache[i].size(), 0.0);
            for (size_t j=0; j<points_cache[i].size(); j++) {
                // Integrate the function l_j(x) according to the measure induced by the function [weight_fn(x) + shift].
                for (size_t k=0; k<ref_points.size(); k++) {
                    weights_cache[i][j] += lagrange_eval(j, points_cache[i], ref_points[k]) * ref_weights[k];
                }
            }
        } else if (gauss_quadrature_version == 2) {
            // Use TasmanianTridiagonalSolver::decompose().
            std::vector<double> dummy_diag = diag;
            std::vector<double> dummy_offdiag = offdiag;
            TasmanianTridiagonalSolver::decompose(dummy_diag, dummy_offdiag, mu0, points_cache[i], weights_cache[i]);
        } else {
            throw std::invalid_argument("ERROR: gauss_quadrature_version must be a valid number!");
        }
        // Update the values of the polynomials at ref_points.
        std::swap(poly_m1_vals, poly_vals);
        std::transform(ref_points.begin(), ref_points.end(), poly_vals.begin(),
                       [&points_cache, i](double x){return poly_eval(points_cache[i], x);});
    }
}